

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

LogicalAndLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_logicaland(NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0x357) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x357;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.logicaland_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::LogicalAndLayerParams>
                   (arena);
    (this->layer_).logicaland_ = (LogicalAndLayerParams *)LVar2;
  }
  return (LogicalAndLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::LogicalAndLayerParams* NeuralNetworkLayer::_internal_mutable_logicaland() {
  if (!_internal_has_logicaland()) {
    clear_layer();
    set_has_logicaland();
    layer_.logicaland_ = CreateMaybeMessage< ::CoreML::Specification::LogicalAndLayerParams >(GetArenaForAllocation());
  }
  return layer_.logicaland_;
}